

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O0

qsizetype QRandomGenerator::SystemGenerator::fillBuffer(void *buffer,qsizetype count)

{
  long in_RSI;
  long in_RDI;
  int ret;
  int ret_1;
  qsizetype read;
  undefined8 local_18;
  
  for (local_18 = 0; 0x100 < in_RSI - local_18; local_18 = local_18 + 0x100) {
    getentropy(in_RDI + local_18,0x100);
  }
  getentropy(in_RDI + local_18,in_RSI - local_18);
  return in_RSI;
}

Assistant:

static qsizetype fillBuffer(void *buffer, qsizetype count) noexcept
    {
        // getentropy can read at most 256 bytes, so break the reading
        qsizetype read = 0;
        while (count - read > 256) {
            // getentropy can't fail under normal circumstances
            int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, 256);
            Q_ASSERT(ret == 0);
            Q_UNUSED(ret);
            read += 256;
        }

        int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, count - read);
        Q_ASSERT(ret == 0);
        Q_UNUSED(ret);
        return count;
    }